

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseSwitchExpr(Parser *this)

{
  TokenType TVar1;
  undefined8 uVar2;
  bool bVar3;
  Parser *in_RSI;
  allocator<char> local_e1;
  undefined1 local_e0 [9];
  undefined7 uStack_d7;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [56];
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> cases;
  Token keyword;
  
  local_d0._8_8_ = this;
  parseExpr((Parser *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"Expected \'{\' before switch expression body.",
             (allocator<char> *)&keyword);
  expect(in_RSI,LEFT_BRACE,(string *)local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  cases.super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cases.super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cases.super__Vector_base<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_0010a7b0:
  TVar1 = (in_RSI->m_current).type;
  if ((TVar1 == RIGHT_BRACE) || (TVar1 == END_OF_FILE)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,"Expected \'}\' after switch expression body.",
               (allocator<char> *)&keyword);
    expect(in_RSI,RIGHT_BRACE,(string *)local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::
    make_unique<enact::SwitchExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::vector<enact::SwitchCase,std::allocator<enact::SwitchCase>>>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c0,
               (vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)local_d0);
    *(undefined8 *)local_d0._8_8_ = local_c0._0_8_;
    std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::~vector(&cases);
    if ((CompileContext *)local_d0._0_8_ != (CompileContext *)0x0) {
      (**(code **)((((string *)local_d0._0_8_)->_M_dataplus)._M_p + 8))();
    }
    return (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>)(Expr *)local_d0._8_8_;
  }
  bVar3 = consume(in_RSI,CASE);
  if (!bVar3) goto LAB_0010a831;
  Token::Token(&keyword,&in_RSI->m_previous);
  parseExpr((Parser *)local_e0);
  std::
  make_unique<enact::ValuePattern,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
            ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_c0);
  uVar2 = local_c0._0_8_;
  local_c0._0_8_ = (_func_int **)0x0;
  if ((CompileContext *)local_e0._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_e0._0_8_)->_M_dataplus)._M_p + 8))();
  }
  bVar3 = consume(in_RSI,WHEN);
  if (bVar3) {
    parseExpr((Parser *)local_e0);
  }
  else {
    local_e0[8] = 1;
    std::make_unique<enact::BooleanExpr,bool>((bool *)local_c0);
    local_e0._0_8_ = local_c0._0_8_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c0,"Expected \'{\' or \'=>\' before switch case body.",&local_e1);
  expectBlock((Parser *)(local_e0 + 8),(string *)in_RSI);
  std::__cxx11::string::~string((string *)local_c0);
  local_c0._8_8_ = local_e0._0_8_;
  local_e0._0_8_ = (CompileContext *)0x0;
  local_b0._0_8_ = CONCAT71(uStack_d7,local_e0[8]);
  local_c0._0_8_ = uVar2;
  Token::Token((Token *)(local_b0 + 8),&keyword);
  std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
  emplace_back<enact::SwitchCase>(&cases,(SwitchCase *)local_c0);
  goto LAB_0010a989;
LAB_0010a831:
  bVar3 = consume(in_RSI,DEFAULT);
  if (bVar3) {
    Token::Token(&keyword,&in_RSI->m_previous);
    std::make_unique<enact::WildcardPattern,enact::Token&>((Token *)local_c0);
    uVar2 = local_c0._0_8_;
    bVar3 = consume(in_RSI,WHEN);
    if (bVar3) {
      parseExpr((Parser *)local_e0);
    }
    else {
      local_e0[8] = 1;
      std::make_unique<enact::BooleanExpr,bool>((bool *)local_c0);
      local_e0._0_8_ = local_c0._0_8_;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,"Expected \'{\' or \'=>\' before default switch case body.",
               &local_e1);
    expectBlock((Parser *)(local_e0 + 8),(string *)in_RSI);
    std::__cxx11::string::~string((string *)local_c0);
    local_c0._8_8_ = local_e0._0_8_;
    local_e0._0_8_ = (CompileContext *)0x0;
    local_b0._0_8_ = CONCAT71(uStack_d7,local_e0[8]);
    local_c0._0_8_ = uVar2;
    Token::Token((Token *)(local_b0 + 8),&keyword);
    std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
    emplace_back<enact::SwitchCase>(&cases,(SwitchCase *)local_c0);
LAB_0010a989:
    SwitchCase::~SwitchCase((SwitchCase *)local_c0);
    if ((CompileContext *)local_e0._0_8_ != (CompileContext *)0x0) {
      (**(code **)((((string *)local_e0._0_8_)->_M_dataplus)._M_p + 8))();
    }
    std::__cxx11::string::~string((string *)&keyword.lexeme);
  }
  goto LAB_0010a7b0;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSwitchExpr() {
        std::unique_ptr<Expr> value = parseExpr();
        expect(TokenType::LEFT_BRACE, "Expected '{' before switch expression body.");

        std::vector<SwitchCase> cases;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::CASE)) {
                Token keyword = m_previous;

                // TODO: add more pattern types
                std::unique_ptr<Pattern> casePattern = std::make_unique<ValuePattern>(parseExpr());
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                    ? parseExpr()
                                                    : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern), std::move(casePredicate), std::move(caseBody), std::move(keyword)});
            } else if (consume(TokenType::DEFAULT)) {
                Token keyword = m_previous;

                std::unique_ptr<Pattern> casePattern = std::make_unique<WildcardPattern>(keyword);
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                      ? parseExpr()
                                                      : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before default switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern),
                                           std::move(casePredicate),
                                           std::move(caseBody),
                                           std::move(keyword)});
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after switch expression body.");

        return std::make_unique<SwitchExpr>(std::move(value), std::move(cases));
    }